

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.cpp
# Opt level: O2

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool *pbVar4;
  int local_3c;
  bool *local_38;
  
  this->output = _stdout;
  this->input1 = _stdin;
  this->input2 = (FILE *)0x0;
  *(undefined4 *)&this->distance = 0xeb851eb8;
  *(undefined4 *)((long)&this->distance + 4) = 0x3f8eb851;
  *(undefined4 *)&this->min_distance = 0xd9d7bdbb;
  *(undefined4 *)((long)&this->min_distance + 4) = 0xbddb7cdf;
  this->ambig = resolve;
  this->format = csv;
  this->overlap = 100;
  this->do_bootstrap = false;
  this->do_bootstrap_two_files = false;
  this->do_count = false;
  this->quiet = false;
  this->quiet = false;
  this->do_fst = false;
  this->skip_header = false;
  this->report_self = false;
  pbVar4 = &this->do_bootstrap;
  this->counts_in_name = ':';
  this->include_prob = 1.0;
  this->ambigs_to_resolve = (char *)0x0;
  this->resolve_fraction = 1.0;
  this->delimiter = ',';
  local_3c = 1;
  do {
    if (argc <= local_3c) {
      return;
    }
    pcVar3 = argv[local_3c];
    if (*pcVar3 == '-') {
      cVar1 = pcVar3[1];
      switch(cVar1) {
      case 'a':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_ambig(this,pcVar3);
        break;
      case 'b':
        *pbVar4 = true;
        break;
      case 'c':
        this->do_count = true;
        break;
      case 'd':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_counts_in_name(this,pcVar3);
        break;
      case 'e':
      case 'i':
      case 'j':
      case 'k':
      case 'p':
switchD_0010841f_caseD_65:
        ERROR("unknown argument: %s",pcVar3);
        break;
      case 'f':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_format(this,pcVar3);
        break;
      case 'g':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_fraction(this,pcVar3);
        break;
      case 'h':
        if (pcVar3[2] != '\0') goto switchD_0010841f_caseD_65;
        help();
        break;
      case 'l':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_overlap(this,pcVar3);
        break;
      case 'm':
        this->do_fst = true;
        break;
      case 'n':
        this->skip_header = true;
        break;
      case 'o':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_output(this,pcVar3);
        break;
      case 'q':
        this->quiet = true;
        break;
      case 'r':
        this->do_bootstrap_two_files = true;
        break;
      case 's':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_second_in(this,pcVar3);
        break;
      case 't':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_distance(this,pcVar3);
        break;
      case 'u':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_include_prob(this,pcVar3);
        break;
      case 'v':
        version();
        break;
      case 'w':
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_min_distance(this,pcVar3);
        break;
      default:
        if (cVar1 == 'D') {
          pcVar3 = next_arg(&local_3c,argc,argv);
          parse_delimiter(this,pcVar3);
        }
        else if (cVar1 == '0') {
          this->report_self = true;
        }
        else {
          if (cVar1 != '-') goto switchD_0010841f_caseD_65;
          local_38 = pbVar4;
          iVar2 = strcmp(pcVar3 + 2,"help");
          if (iVar2 == 0) {
            help();
            pbVar4 = local_38;
          }
          else {
            iVar2 = strcmp(pcVar3 + 2,"version");
            if (iVar2 == 0) {
              version();
              pbVar4 = local_38;
            }
            else {
              ERROR("unknown argument: %s",pcVar3);
              pbVar4 = local_38;
            }
          }
        }
      }
    }
    else {
      if (local_3c != argc + -1) goto switchD_0010841f_caseD_65;
      parse_input(this,pcVar3);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
  output( stdout ),
  input1( stdin ),
  input2( NULL ),
  distance( DEFAULT_DISTANCE ),
  min_distance( DEFAULT_MIN_DISTANCE ),
  ambig( DEFAULT_AMBIG ),
  format ( DEFAULT_FORMAT ),
  overlap ( DEFAULT_OVERLAP ),
  do_bootstrap( false ),
  do_bootstrap_two_files ( false ),
  do_count( false ),
  quiet( false ),
  do_fst( false ),
  skip_header ( false ),
  report_self ( false ),
  counts_in_name ( DEFAULT_COUNTS_IN_NAME ),
  include_prob( DEFAULT_INCLUDE_PROB ),
  ambigs_to_resolve(NULL),
  resolve_fraction(DEFAULT_FRACTION),
  delimiter (DEFAULT_DELIMITER)
  {
      // skip arg[0], it's just the program name
    for (int i = 1; i < argc; ++i ) {
      const char * arg = argv[i];
      
      if ( arg[0] == '-' && arg[1] == '-' ) {
        if ( !strcmp( &arg[2], "help" ) ) help();
        else if ( !strcmp( &arg[2], "version" ) ) version();
        else
          ERROR( "unknown argument: %s", arg );
      }
      else if ( arg[0] == '-' ) {
        if ( !strcmp( &arg[1], "h" ) ) help();
        else if (  arg[1] == 'v' ) version();
        else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
        else if (  arg[1] == 't' ) parse_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'w' ) parse_min_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'l')  parse_overlap( next_arg (i, argc, argv) );
        else if (  arg[1] == 'f')  parse_format( next_arg (i, argc, argv) );
        else if (  arg[1] == 'a')  parse_ambig( next_arg (i, argc, argv) );
        else if (  arg[1] == 's')  parse_second_in( next_arg (i, argc, argv) );
        else if (  arg[1] == 'd')  parse_counts_in_name( next_arg (i, argc, argv) );
        else if (  arg[1] == 'u')  parse_include_prob( next_arg (i, argc, argv) );
        else if (  arg[1] == 'D')  parse_delimiter ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'b')  parse_bootstrap();
        else if (  arg[1] == 'r')  parse_bootstrap_two_files ();
        else if (  arg[1] == 'c')  parse_count();
        else if (  arg[1] == 'n')  parse_no_header ();
        else if (  arg[1] == 'q')  parse_quiet();
        else if (  arg[1] == 'm')  parse_fst();
        else if (  arg[1] == '0')  parse_report_self();
        else if (  arg[1] == 'g')  parse_fraction( next_arg (i, argc, argv) );
        else
          ERROR( "unknown argument: %s", arg );
      }
      else
        if (i == argc-1) {
          parse_input (arg);
        } else {
          ERROR( "unknown argument: %s", arg );
        }
    }
  }